

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

ArrayPtr<void_*const>
kj::computeRelativeTrace(ArrayPtr<void_*const> trace,ArrayPtr<void_*const> relativeTo)

{
  size_t sVar1;
  size_t sVar2;
  WiderType<Decay<long>,_Decay<long>_> WVar3;
  WiderType<Decay<long>,_Decay<long_&>_> WVar4;
  ArrayPtr<void_*const> AVar5;
  void **local_b8;
  void **local_b0;
  long lStack_80;
  uint matchLen;
  undefined1 local_78 [8];
  ArrayPtr<void_*const> subrt;
  long local_60;
  undefined1 local_58 [8];
  ArrayPtr<void_*const> subtrace;
  ssize_t i;
  undefined1 auStack_38 [4];
  uint bestMatchLen;
  ArrayPtr<void_*const> relativeTo_local;
  ArrayPtr<void_*const> trace_local;
  ArrayPtr<void_*const> bestMatch;
  
  bestMatch.ptr = (void **)trace.size_;
  relativeTo_local.size_ = (size_t)trace.ptr;
  relativeTo_local.ptr = (void **)relativeTo.size_;
  _auStack_38 = relativeTo.ptr;
  sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)&relativeTo_local.size_);
  if ((sVar1 < 4) ||
     (sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_38), sVar1 < 4)) {
    trace_local.size_ = relativeTo_local.size_;
  }
  else {
    trace_local.size_ = relativeTo_local.size_;
    i._4_4_ = 3;
    sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)&relativeTo_local.size_);
    for (subtrace.size_ = -(sVar1 - 4); sVar1 = subtrace.size_,
        sVar2 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_38),
        (long)sVar1 <= (long)(sVar2 - 4); subtrace.size_ = subtrace.size_ + 1) {
      sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)&relativeTo_local.size_);
      local_60 = 0;
      subrt.size_ = -subtrace.size_;
      WVar3 = max<long,long>(&stack0xffffffffffffffa0,(long *)&subrt.size_);
      _local_58 = ArrayPtr<void_*const>::first
                            ((ArrayPtr<void_*const> *)&relativeTo_local.size_,sVar1 - WVar3);
      sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_38);
      lStack_80 = 0;
      WVar4 = max<long,long&>(&stack0xffffffffffffff80,(long *)&subtrace.size_);
      _local_78 = ArrayPtr<void_*const>::first((ArrayPtr<void_*const> *)auStack_38,sVar1 - WVar4);
      sVar1 = anon_unknown_70::sharedSuffixLength(_local_58,_local_78);
      if (i._4_4_ < (uint)sVar1) {
        sVar2 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)local_58);
        AVar5 = ArrayPtr<void_*const>::first
                          ((ArrayPtr<void_*const> *)local_58,(sVar2 - (sVar1 & 0xffffffff)) + 1);
        local_b8 = AVar5.ptr;
        trace_local.size_ = (size_t)local_b8;
        local_b0 = (void **)AVar5.size_;
        bestMatch.ptr = local_b0;
        i._4_4_ = (uint)sVar1;
      }
    }
  }
  AVar5.size_ = (size_t)bestMatch.ptr;
  AVar5.ptr = (void **)trace_local.size_;
  return AVar5;
}

Assistant:

kj::ArrayPtr<void* const> computeRelativeTrace(
    kj::ArrayPtr<void* const> trace, kj::ArrayPtr<void* const> relativeTo) {
  using miniposix::ssize_t;

  static constexpr size_t MIN_MATCH_LEN = 4;
  if (trace.size() < MIN_MATCH_LEN || relativeTo.size() < MIN_MATCH_LEN) {
    return trace;
  }

  kj::ArrayPtr<void* const> bestMatch = trace;
  uint bestMatchLen = MIN_MATCH_LEN - 1;  // must beat this to choose something else

  // `trace` and `relativeTrace` may have been truncated at different points. We iterate through
  // truncating various suffixes from one of the two and then seeing if the remaining suffixes
  // match.
  for (ssize_t i = -(ssize_t)(trace.size() - MIN_MATCH_LEN);
       i <= (ssize_t)(relativeTo.size() - MIN_MATCH_LEN);
       i++) {
    // Negative values truncate `trace`, positive values truncate `relativeTo`.
    kj::ArrayPtr<void* const> subtrace = trace.first(trace.size() - kj::max<ssize_t>(0, -i));
    kj::ArrayPtr<void* const> subrt = relativeTo
        .first(relativeTo.size() - kj::max<ssize_t>(0, i));

    uint matchLen = sharedSuffixLength(subtrace, subrt);
    if (matchLen > bestMatchLen) {
      bestMatchLen = matchLen;
      bestMatch = subtrace.first(subtrace.size() - matchLen + 1);
    }
  }

  return bestMatch;
}